

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::CovergroupDeclarationSyntax::CovergroupDeclarationSyntax
          (CovergroupDeclarationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token covergroup,
          Token extends,Token name,FunctionPortListSyntax *portList,SyntaxNode *event,Token semi,
          SyntaxList<slang::syntax::MemberSyntax> *members,Token endgroup,
          NamedBlockClauseSyntax *endBlockName)

{
  undefined4 uVar1;
  bool bVar2;
  reference ppMVar3;
  SyntaxNode *in_RCX;
  SyntaxNode *in_RDX;
  SyntaxNode *in_RDI;
  undefined8 in_R8;
  SyntaxNode *in_R9;
  SyntaxNode *in_stack_00000018;
  SyntaxNode *in_stack_00000020;
  MemberSyntax *child;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::MemberSyntax> *__range2;
  SyntaxList<slang::syntax::MemberSyntax> *in_stack_ffffffffffffff88;
  SyntaxList<slang::syntax::MemberSyntax> *this_00;
  span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *this_01;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
  in_stack_ffffffffffffffc0;
  
  this_01 = (span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *)&child;
  this_00 = (SyntaxList<slang::syntax::MemberSyntax> *)&stack0x00000008;
  MemberSyntax::MemberSyntax
            ((MemberSyntax *)in_stack_ffffffffffffffc0._M_current,
             (SyntaxKind)((ulong)in_stack_ffffffffffffffb8 >> 0x20),in_stack_ffffffffffffffb0);
  in_RDI[3].parent = in_RDX;
  in_RDI[3].previewNode = in_RCX;
  *(undefined8 *)(in_RDI + 4) = in_R8;
  in_RDI[4].parent = in_R9;
  in_RDI[4].previewNode = (SyntaxNode *)(this_00->super_SyntaxListBase)._vptr_SyntaxListBase;
  uVar1 = *(undefined4 *)&(this_00->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  in_RDI[5].kind = (this_00->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&in_RDI[5].field_0x4 = uVar1;
  in_RDI[5].parent = in_stack_00000018;
  in_RDI[5].previewNode = in_stack_00000020;
  *(MemberSyntax **)(in_RDI + 6) = (MemberSyntax *)this_01->_M_ptr;
  in_RDI[6].parent = (SyntaxNode *)(this_01->_M_extent)._M_extent_value;
  SyntaxList<slang::syntax::MemberSyntax>::SyntaxList(this_00,in_stack_ffffffffffffff88);
  *(SyntaxList<slang::syntax::MemberSyntax> **)(in_RDI + 9) = __range2;
  in_RDI[9].parent = (SyntaxNode *)attributes;
  in_RDI[9].previewNode = (SyntaxNode *)this;
  if (in_RDI[5].parent != (SyntaxNode *)0x0) {
    (in_RDI[5].parent)->parent = in_RDI;
  }
  if (in_RDI[5].previewNode != (SyntaxNode *)0x0) {
    (in_RDI[5].previewNode)->parent = in_RDI;
  }
  in_RDI[7].parent = in_RDI;
  std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::begin
            ((span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *)
             in_stack_ffffffffffffff88);
  std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::end(this_01);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                      ((__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                        *)this_00,
                       (__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff88);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    ppMVar3 = __gnu_cxx::
              __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
              ::operator*((__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                           *)&stack0xffffffffffffffc0);
    ((*ppMVar3)->super_SyntaxNode).parent = in_RDI;
    __gnu_cxx::
    __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
    ::operator++((__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                  *)&stack0xffffffffffffffc0);
  }
  if (in_RDI[9].previewNode != (SyntaxNode *)0x0) {
    (in_RDI[9].previewNode)->parent = in_RDI;
  }
  return;
}

Assistant:

CovergroupDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token covergroup, Token extends, Token name, FunctionPortListSyntax* portList, SyntaxNode* event, Token semi, const SyntaxList<MemberSyntax>& members, Token endgroup, NamedBlockClauseSyntax* endBlockName) :
        MemberSyntax(SyntaxKind::CovergroupDeclaration, attributes), covergroup(covergroup), extends(extends), name(name), portList(portList), event(event), semi(semi), members(members), endgroup(endgroup), endBlockName(endBlockName) {
        if (this->portList) this->portList->parent = this;
        if (this->event) this->event->parent = this;
        this->members.parent = this;
        for (auto child : this->members)
            child->parent = this;
        if (this->endBlockName) this->endBlockName->parent = this;
    }